

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O3

FuncVec * __thiscall
dg::llvmdg::LazyLLVMCallGraph::callees
          (FuncVec *__return_storage_ptr__,LazyLLVMCallGraph *this,Function *F)

{
  _Base_ptr p_Var1;
  pointer *pppFVar2;
  iterator __position;
  _Base_ptr p_Var3;
  _Base_ptr *pp_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var3 = (this->_cg)._mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var7 = &(this->_cg)._mapping._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var5 = p_Var7;
  p_Var6 = p_Var3;
  if (p_Var3 != (_Base_ptr)0x0) {
    do {
      p_Var1 = p_Var6 + 1;
      if (*(Function **)p_Var1 >= F) {
        p_Var5 = p_Var6;
      }
      pp_Var4 = &p_Var6->_M_left;
      p_Var6 = pp_Var4[*(Function **)p_Var1 < F];
    } while (pp_Var4[*(Function **)p_Var1 < F] != (_Base_ptr)0x0);
    if ((p_Var5 != p_Var7) && (*(Function **)(p_Var5 + 1) <= F)) goto LAB_00116ab6;
  }
  _populateCalledFunctions(this,F);
  p_Var3 = (this->_cg)._mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
LAB_00116ab6:
  do {
    if (*(Function **)(p_Var3 + 1) >= F) {
      p_Var7 = p_Var3;
    }
    p_Var3 = (&p_Var3->_M_left)[*(Function **)(p_Var3 + 1) < F];
  } while (p_Var3 != (_Base_ptr)0x0);
  pp_Var4 = (_Base_ptr *)0x0;
  if (*(Function **)(p_Var7 + 1) <= F) {
    pp_Var4 = &p_Var7[1]._M_parent;
  }
  p_Var3 = pp_Var4[2];
  for (p_Var7 = pp_Var4[1]; p_Var7 != p_Var3; p_Var7 = (_Base_ptr)&p_Var7->_M_parent) {
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<llvm::Function_const*,std::allocator<llvm::Function_const*>>::
      _M_realloc_insert<llvm::Function_const*const&>
                ((vector<llvm::Function_const*,std::allocator<llvm::Function_const*>> *)
                 __return_storage_ptr__,__position,(Function **)(*(long *)p_Var7 + 0x38));
    }
    else {
      *__position._M_current = *(Function **)(*(long *)p_Var7 + 0x38);
      pppFVar2 = &(__return_storage_ptr__->
                  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppFVar2 = *pppFVar2 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FuncVec callees(const llvm::Function *F) override {
        FuncVec ret;
        if (!hasFn(F)) {
            _populateCalledFunctions(F);
        }
        auto fnd = _cg.get(F);
        for (auto *nd : fnd->getCalls()) {
            ret.push_back(nd->getValue());
        }
        return ret;
    }